

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  long __off;
  undefined1 local_100 [8];
  stbi__context s;
  
  __off = ftell((FILE *)f);
  s._184_8_ = &s.read_from_callbacks;
  s.io.skip = stbi__stdio_eof;
  s._8_8_ = stbi__stdio_read;
  s.io.read = stbi__stdio_skip;
  s.io_user_data = (void *)0x8000000001;
  s.buffer_start[0x78] = '\0';
  s.buffer_start[0x79] = '\0';
  s.buffer_start[0x7a] = '\0';
  s.buffer_start[0x7b] = '\0';
  s.io.eof = (_func_int_void_ptr *)f;
  s.img_buffer_end = (stbi_uc *)s._184_8_;
  stbi__refill_buffer((stbi__context *)local_100);
  s.img_buffer_original = s.img_buffer;
  iVar1 = stbi__hdr_test((stbi__context *)local_100);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   long pos = ftell(f);
   int res;
   stbi__context s;
   stbi__start_file(&s,f);
   res = stbi__hdr_test(&s);
   fseek(f, pos, SEEK_SET);
   return res;
   #else
   STBI_NOTUSED(f);
   return 0;
   #endif
}